

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZModule.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  MCRegisterInfo *mri;
  cs_struct *ud_local;
  
  if ((*(uint *)(ctx + 4) & 0x7fffffef) == 0) {
    MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
    Sparc_init(MRI);
    *(code **)(ctx + 8) = Sparc_printInst;
    *(MCRegisterInfo **)(ctx + 0x10) = MRI;
    *(MCRegisterInfo **)(ctx + 0x20) = MRI;
    *(code **)(ctx + 0x18) = Sparc_getInstruction;
    *(code **)(ctx + 0x50) = Sparc_post_printer;
    *(code **)(ctx + 0x30) = Sparc_reg_name;
    *(code **)(ctx + 0x48) = Sparc_get_insn_id;
    *(code **)(ctx + 0x38) = Sparc_insn_name;
    *(code **)(ctx + 0x40) = Sparc_group_name;
    ud_local._4_4_ = 0;
  }
  else {
    ud_local._4_4_ = 5;
  }
  return ud_local._4_4_;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	mri = cs_mem_malloc(sizeof(*mri));

	SystemZ_init(mri);
	ud->printer = SystemZ_printInst;
	ud->printer_info = mri;
	ud->getinsn_info = mri;
	ud->disasm = SystemZ_getInstruction;
	ud->post_printer = SystemZ_post_printer;

	ud->reg_name = SystemZ_reg_name;
	ud->insn_id = SystemZ_get_insn_id;
	ud->insn_name = SystemZ_insn_name;
	ud->group_name = SystemZ_group_name;

	return CS_ERR_OK;
}